

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  string *psVar1;
  shared_ptr<TUPU::TImage> timg;
  vector<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_> images3;
  string imgPath4;
  string imgPath3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  images2;
  string imgPath2;
  string imgPath1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  images1;
  string imgUrl;
  long start;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sequenceIds;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  int rc;
  long statusCode;
  string result;
  Recognition *rec;
  string secretId;
  string *filepath;
  TImage *in_stack_fffffffffffffa40;
  string *in_stack_fffffffffffffa48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa50;
  int in_stack_fffffffffffffa5c;
  char *in_stack_fffffffffffffa60;
  allocator_type *in_stack_fffffffffffffa68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa70;
  iterator in_stack_fffffffffffffa78;
  Recognition *in_stack_fffffffffffffa80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffb38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tags_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffb40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *images;
  long *in_stack_fffffffffffffb48;
  string *in_stack_fffffffffffffb50;
  string *result_00;
  string *in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb64;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffb70;
  string *local_480;
  string *local_448;
  string *local_418;
  string *local_3e8;
  allocator local_3a9;
  string local_3a8 [39];
  allocator local_381;
  string local_380 [79];
  allocator local_331;
  string local_330 [39];
  allocator local_309;
  string local_308 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_2e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_2e0;
  undefined8 local_2d8;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  string *local_2a0;
  string local_298 [32];
  char *in_stack_fffffffffffffd88;
  char *in_stack_fffffffffffffd90;
  char *in_stack_fffffffffffffd98;
  vector<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_>
  *in_stack_fffffffffffffda0;
  string *local_258;
  undefined8 local_250;
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [40];
  string *local_1d8;
  string local_1d0 [32];
  string *local_1b0;
  undefined8 local_1a8;
  long *in_stack_fffffffffffffe68;
  string *in_stack_fffffffffffffe70;
  vector<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_>
  *in_stack_fffffffffffffe78;
  string *in_stack_fffffffffffffe80;
  Recognition *in_stack_fffffffffffffe88;
  allocator local_151;
  string *local_150;
  string local_148 [32];
  string *local_128;
  undefined8 local_120;
  undefined1 local_fa;
  allocator local_f9;
  string *local_f8;
  string local_f0 [32];
  string *local_d0;
  undefined8 local_c8;
  int local_a4;
  undefined8 local_a0;
  string local_98 [38];
  undefined1 local_72;
  allocator local_71;
  string local_70 [32];
  string *local_50;
  allocator local_31;
  string local_30 [44];
  int local_4;
  
  local_4 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"your_secret_id",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  psVar1 = (string *)operator_new(0x88);
  local_72 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"Path-of-Your-PKCS8-Private-Key",&local_71);
  TUPU::Recognition::Recognition(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  local_72 = 0;
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  local_50 = psVar1;
  std::__cxx11::string::string(local_98);
  local_a0 = 0;
  local_a4 = 0;
  local_fa = 1;
  local_f8 = local_f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"Funny",&local_f9);
  local_fa = 0;
  local_d0 = local_f0;
  local_c8 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x19f3f9);
  __l._M_len = (size_type)in_stack_fffffffffffffa80;
  __l._M_array = in_stack_fffffffffffffa78;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_fffffffffffffa70,__l,in_stack_fffffffffffffa68);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x19f42d);
  local_3e8 = (string *)&local_d0;
  do {
    local_3e8 = local_3e8 + -0x20;
    std::__cxx11::string::~string(local_3e8);
  } while (local_3e8 != local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  local_150 = local_148;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_148,"SequenceA",&local_151);
  local_128 = local_148;
  local_120 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x19f518);
  __l_00._M_len = (size_type)in_stack_fffffffffffffa80;
  __l_00._M_array = in_stack_fffffffffffffa78;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_fffffffffffffa70,__l_00,in_stack_fffffffffffffa68);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x19f54c);
  local_418 = (string *)&local_128;
  do {
    local_418 = local_418 + -0x20;
    std::__cxx11::string::~string(local_418);
  } while (local_418 != local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  getTime();
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffe80,"http://www.yourdomain.com/img/1.jpg",
             (allocator *)&stack0xfffffffffffffe7f);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe7f);
  local_1d8 = local_1d0;
  std::__cxx11::string::string(local_1d8,(string *)&stack0xfffffffffffffe80);
  local_1b0 = local_1d0;
  local_1a8 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x19f65a);
  __l_01._M_len = (size_type)in_stack_fffffffffffffa80;
  __l_01._M_array = in_stack_fffffffffffffa78;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_fffffffffffffa70,__l_01,in_stack_fffffffffffffa68);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x19f68e);
  local_448 = (string *)&local_1b0;
  do {
    local_448 = local_448 + -0x20;
    std::__cxx11::string::~string(local_448);
  } while (local_448 != local_1d0);
  local_a4 = TUPU::Recognition::performWithURL
                       ((Recognition *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60)
                        ,in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
                        in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,
                        in_stack_fffffffffffffb38,in_stack_fffffffffffffb70);
  printResult(in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c,(long)in_stack_fffffffffffffa50,
              in_stack_fffffffffffffa48,(long)in_stack_fffffffffffffa40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"/home/user/img/1.jpg",&local_201);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"/home/user/img/2.jpg",&local_229);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  local_2a0 = local_298;
  std::__cxx11::string::string(local_2a0,local_200);
  local_2a0 = (string *)&stack0xfffffffffffffd88;
  std::__cxx11::string::string(local_2a0,local_228);
  local_258 = local_298;
  local_250 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x19f856);
  __l_02._M_len = (size_type)in_stack_fffffffffffffa80;
  __l_02._M_array = in_stack_fffffffffffffa78;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_fffffffffffffa70,__l_02,in_stack_fffffffffffffa68);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x19f88a);
  local_480 = (string *)&local_258;
  do {
    local_480 = local_480 + -0x20;
    std::__cxx11::string::~string(local_480);
  } while (local_480 != local_298);
  getTime();
  tags_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x0;
  images = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x0;
  local_2c8 = 0;
  uStack_2c0 = 0;
  local_2b8 = 0;
  psVar1 = (string *)&local_2c8;
  result_00 = local_50;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x19f93f);
  local_2d8 = 0;
  filepath = (string *)&local_2e8;
  local_2e8 = tags_00;
  pvStack_2e0 = images;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x19f970);
  local_a4 = TUPU::Recognition::performWithPath
                       ((Recognition *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60)
                        ,psVar1,result_00,(long *)filepath,images,tags_00,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_480);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffa50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffa50);
  printResult(in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c,(long)in_stack_fffffffffffffa50,
              in_stack_fffffffffffffa48,(long)in_stack_fffffffffffffa40);
  getTime();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_308,"/home/user/img/3.jpg",&local_309);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_330,"/home/user/img/4.jpg",&local_331);
  std::allocator<char>::~allocator((allocator<char> *)&local_331);
  std::vector<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_>::
  vector((vector<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_> *)
         0x19fac5);
  std::__cxx11::string::c_str();
  loadImage(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
            in_stack_fffffffffffffd88);
  std::make_shared<TUPU::TImage>();
  std::__shared_ptr_access<TUPU::TImage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<TUPU::TImage,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x19fb0e
            );
  TUPU::TImage::setPath(in_stack_fffffffffffffa40,filepath);
  std::__shared_ptr_access<TUPU::TImage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<TUPU::TImage,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x19fb2d
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_380,"Room103",&local_381);
  TUPU::TImage::setTag(in_stack_fffffffffffffa40,filepath);
  std::__cxx11::string::~string(local_380);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  std::__shared_ptr_access<TUPU::TImage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<TUPU::TImage,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x19fba6
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3a8,"xxx123",&local_3a9);
  TUPU::TImage::setSequenceId(in_stack_fffffffffffffa40,filepath);
  std::__cxx11::string::~string(local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
  std::vector<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_>::
  push_back((vector<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_>
             *)in_stack_fffffffffffffa50,(value_type *)in_stack_fffffffffffffa48);
  local_a4 = TUPU::Recognition::perform
                       (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                        in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                        in_stack_fffffffffffffe68);
  printResult(in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c,(long)in_stack_fffffffffffffa50,
              in_stack_fffffffffffffa48,(long)in_stack_fffffffffffffa40);
  if (local_50 != (string *)0x0) {
    (**(code **)(*(long *)local_50 + 8))();
  }
  local_4 = 0;
  std::shared_ptr<TUPU::TImage>::~shared_ptr((shared_ptr<TUPU::TImage> *)0x19fcd6);
  std::vector<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_>::
  ~vector((vector<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_> *)
          in_stack_fffffffffffffa50);
  std::__cxx11::string::~string(local_330);
  std::__cxx11::string::~string(local_308);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffa50);
  std::__cxx11::string::~string(local_228);
  std::__cxx11::string::~string(local_200);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffa50);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffa50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffa50);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_30);
  return local_4;
}

Assistant:

int main(int argc, char *argv[]) {
    string secretId = "your_secret_id";
    Recognition *rec = new Recognition("Path-of-Your-PKCS8-Private-Key");

    //Set sub-user identifier for billing and statistics (optional feature)
    // int rs = rec->setUID("user-bucket-xyz");
    // if (rs != 0) {
    //     return rs;
    // }

    string result;
    long statusCode = 0;
    int rc = 0;
    vector<string> tags = {"Funny"}; //number of tags may be less than number of images
    vector<string> sequenceIds = {"SequenceA"}; //number of sequenceIds may be less than number of images
    long start = getTime();

    /*********** imageUrl *****************/
    //Providing URLs of images with tags & sequenceIds (optional)
    string imgUrl = "http://www.yourdomain.com/img/1.jpg";
    vector<string> images1 = { imgUrl };
    rc = rec->performWithURL(secretId, result, &statusCode, images1, tags, sequenceIds);
    printResult("using image URL with tag & sequenceId", rc, statusCode, result, start);
    /*************************************/

    /*********** imagePath *****************/
    string imgPath1 = "/home/user/img/1.jpg";
    string imgPath2 = "/home/user/img/2.jpg";
    vector<string> images2 = { imgPath1, imgPath2 };
    start = getTime();
    //Providing paths of images without tags (optional)
    rc = rec->performWithPath(secretId, result, &statusCode, images2);
    printResult("using image path", rc, statusCode, result, start);
    /*************************************/

    /*********** imageContent *****************/
    start = getTime();
    // Providing image binary and path
    string imgPath3 = "/home/user/img/3.jpg";
    string imgPath4 = "/home/user/img/4.jpg";
    vector<shared_ptr<TImage>> images3;
    loadImage(images3, imgPath3.c_str(), "Room102", "xxx111");
    shared_ptr<TImage> timg = std::make_shared<TImage>();
    timg->setPath(imgPath4);
    timg->setTag("Room103");
    timg->setSequenceId("xxx123");
    images3.push_back(timg);
    rc = rec->perform(secretId, images3, result, &statusCode);
    printResult("using image binary with tag & sequenceId", rc, statusCode, result, start);
    /*************************************/

    delete rec;

    return 0;
}